

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentParserHelper.cxx
# Opt level: O2

char * __thiscall
cmCommandArgumentParserHelper::ExpandVariable(cmCommandArgumentParserHelper *this,char *var)

{
  cmMakefile *pcVar1;
  Snapshot snapshot;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  ostream *poVar5;
  cmake *this_00;
  cmListFileContext *this_01;
  allocator local_263;
  allocator local_262;
  allocator local_261;
  string local_260;
  cmListFileContext lfc;
  cmOutputConverter converter;
  string local_1d8;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  PositionType local_1a8;
  ostringstream ostr;
  
  if (var == (char *)0x0) {
    return (char *)0x0;
  }
  if ((-1 < this->FileLine) && (iVar3 = strcmp(var,"CMAKE_CURRENT_LIST_LINE"), iVar3 == 0)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ostr);
    std::ostream::_M_insert<long>((long)&ostr);
    std::__cxx11::stringbuf::str();
    pcVar4 = AddString(this,&lfc.Name);
    std::__cxx11::string::~string((string *)&lfc);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ostr);
    return pcVar4;
  }
  pcVar1 = this->Makefile;
  std::__cxx11::string::string((string *)&ostr,var,(allocator *)&lfc);
  pcVar4 = cmMakefile::GetDefinition(pcVar1,(string *)&ostr);
  std::__cxx11::string::~string((string *)&ostr);
  if (pcVar4 == (char *)0x0) {
    if (this->RemoveEmpty == false) {
      if (this->WarnUninitialized != true) {
        return (char *)0x0;
      }
      pcVar1 = this->Makefile;
      std::__cxx11::string::string((string *)&ostr,var,(allocator *)&lfc);
      bVar2 = cmMakefile::VariableInitialized(pcVar1,(string *)&ostr);
      std::__cxx11::string::~string((string *)&ostr);
      if (bVar2) {
        return (char *)0x0;
      }
      if (this->CheckSystemVars == false) {
        std::__cxx11::string::string((string *)&ostr,this->FileName,(allocator *)&local_1d8);
        pcVar4 = cmMakefile::GetHomeDirectory(this->Makefile);
        std::__cxx11::string::string((string *)&lfc,pcVar4,&local_263);
        bVar2 = cmsys::SystemTools::IsSubDirectory((string *)&ostr,&lfc.Name);
        if (bVar2) {
          std::__cxx11::string::~string((string *)&lfc);
          std::__cxx11::string::~string((string *)&ostr);
        }
        else {
          std::__cxx11::string::string((string *)&converter,this->FileName,&local_261);
          pcVar4 = cmMakefile::GetHomeOutputDirectory(this->Makefile);
          std::__cxx11::string::string((string *)&local_260,pcVar4,&local_262);
          bVar2 = cmsys::SystemTools::IsSubDirectory((string *)&converter,&local_260);
          std::__cxx11::string::~string((string *)&local_260);
          std::__cxx11::string::~string((string *)&converter);
          std::__cxx11::string::~string((string *)&lfc);
          std::__cxx11::string::~string((string *)&ostr);
          if (!bVar2) {
            return (char *)0x0;
          }
        }
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ostr);
      lfc.Name._M_dataplus._M_p = (pointer)&lfc.Name.field_2;
      lfc.Name._M_string_length = 0;
      lfc.Name.field_2._M_local_buf[0] = '\0';
      lfc.FilePath._M_dataplus._M_p = (pointer)&lfc.FilePath.field_2;
      lfc.FilePath._M_string_length = 0;
      lfc.FilePath.field_2._M_local_buf[0] = '\0';
      lfc.Line = 0;
      cmMakefile::GetStateSnapshot(this->Makefile);
      snapshot.Position.Tree = (cmLinkedTree<cmState::SnapshotDataType> *)uStack_1b0;
      snapshot.State = (cmState *)local_1b8;
      snapshot.Position.Position = local_1a8;
      cmOutputConverter::cmOutputConverter(&converter,snapshot);
      std::__cxx11::string::string((string *)&local_1d8,this->FileName,&local_263);
      cmOutputConverter::Convert(&local_260,&converter,&local_1d8,HOME,UNCHANGED);
      std::__cxx11::string::operator=((string *)&lfc.FilePath,(string *)&local_260);
      std::__cxx11::string::~string((string *)&local_260);
      std::__cxx11::string::~string((string *)&local_1d8);
      lfc.Line = this->FileLine;
      poVar5 = std::operator<<((ostream *)&ostr,"uninitialized variable \'");
      poVar5 = std::operator<<(poVar5,var);
      std::operator<<(poVar5,"\'");
      this_00 = cmMakefile::GetCMakeInstance(this->Makefile);
      std::__cxx11::stringbuf::str();
      cmake::IssueMessage(this_00,AUTHOR_WARNING,&local_260,&lfc);
      std::__cxx11::string::~string((string *)&local_260);
      cmListFileContext::~cmListFileContext(&lfc);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ostr);
      return (char *)0x0;
    }
    pcVar4 = "";
  }
  else if (this->EscapeQuotes == true) {
    std::__cxx11::string::string((string *)&lfc,pcVar4,(allocator *)&converter);
    cmSystemTools::EscapeQuotes((string *)&ostr,&lfc.Name);
    pcVar4 = AddString(this,(string *)&ostr);
    std::__cxx11::string::~string((string *)&ostr);
    this_01 = &lfc;
    goto LAB_00345ae6;
  }
  std::__cxx11::string::string((string *)&ostr,pcVar4,(allocator *)&lfc);
  pcVar4 = AddString(this,(string *)&ostr);
  this_01 = (cmListFileContext *)&ostr;
LAB_00345ae6:
  std::__cxx11::string::~string((string *)this_01);
  return pcVar4;
}

Assistant:

char* cmCommandArgumentParserHelper::ExpandVariable(const char* var)
{
  if(!var)
    {
    return 0;
    }
  if(this->FileLine >= 0 && strcmp(var, "CMAKE_CURRENT_LIST_LINE") == 0)
    {
    std::ostringstream ostr;
    ostr << this->FileLine;
    return this->AddString(ostr.str());
    }
  const char* value = this->Makefile->GetDefinition(var);
  if(!value && !this->RemoveEmpty)
    {
    // check to see if we need to print a warning
    // if strict mode is on and the variable has
    // not been "cleared"/initialized with a set(foo ) call
    if(this->WarnUninitialized && !this->Makefile->VariableInitialized(var))
      {
      if (this->CheckSystemVars ||
          cmSystemTools::IsSubDirectory(this->FileName,
                                        this->Makefile->GetHomeDirectory()) ||
          cmSystemTools::IsSubDirectory(this->FileName,
                                     this->Makefile->GetHomeOutputDirectory()))
        {
        std::ostringstream msg;
        cmListFileContext lfc;
        cmOutputConverter converter(this->Makefile->GetStateSnapshot());
        lfc.FilePath = converter.Convert(this->FileName,
                                         cmOutputConverter::HOME);

        lfc.Line = this->FileLine;
        msg << "uninitialized variable \'" << var << "\'";
        this->Makefile->GetCMakeInstance()->IssueMessage(cmake::AUTHOR_WARNING,
                                                        msg.str(), lfc);
        }
      }
    return 0;
    }
  if (this->EscapeQuotes && value)
    {
    return this->AddString(cmSystemTools::EscapeQuotes(value));
    }
  return this->AddString(value ? value : "");
}